

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

int * vrna_idx_row_wise(uint length)

{
  int *piVar1;
  ulong uVar2;
  uint uVar3;
  
  piVar1 = (int *)vrna_alloc(length * 4 + 4);
  uVar3 = length;
  for (uVar2 = 1; length + 1 != uVar2; uVar2 = uVar2 + 1) {
    piVar1[uVar2] = (uVar3 * (uVar3 - 1) >> 1) + length + 1;
    uVar3 = uVar3 - 1;
  }
  return piVar1;
}

Assistant:

PUBLIC int *
vrna_idx_row_wise(unsigned int length)
{
  int i;
  int *idx = (int *)vrna_alloc(sizeof(int) * (length + 1));

  for (i = 1; i <= length; i++)
    idx[i] = (((length + 1 - i) * (length - i)) / 2) + length + 1;
  return idx;
}